

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellBST::SetupInitial(ChElementShellBST *this,ChSystem *system)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer psVar6;
  element_type *peVar7;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar40;
  ChLog *this_00;
  long lVar41;
  long lVar42;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  long in_R10;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  double dVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined4 in_stack_ffffff87;
  double local_208;
  double dStack_200;
  double local_1f8;
  double local_1e8;
  double adStack_1e0 [6];
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_60 [16];
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  undefined1 auVar59 [32];
  
  SetAsNeutral(this);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(local_78);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  dVar115 = (double)local_78._0_8_ - local_208;
  local_158 = (double)local_78._8_8_ - dStack_200;
  local_1a8 = local_68 - local_1f8;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_1a8;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_158;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar115;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = adStack_1e0[1] - local_130;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = (adStack_1e0[0] - local_138) * local_1a8;
  auVar11 = vfmsub231sd_fma(auVar108,auVar121,auVar97);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_1e8 - local_140;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (adStack_1e0[1] - local_130) * dVar115;
  auVar52 = vfmsub231sd_fma(auVar98,auVar68,auVar130);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = (local_1e8 - local_140) * local_158;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = adStack_1e0[0] - local_138;
  auVar53 = vfmsub231sd_fma(auVar69,auVar116,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = auVar52._0_8_ * auVar52._0_8_;
  auVar11 = vfmadd231sd_fma(auVar85,auVar11,auVar11);
  auVar11 = vfmadd231sd_fma(auVar11,auVar53,auVar53);
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  this->area = auVar11._0_8_ * 0.5;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  local_198 = local_1f8 - adStack_1e0[1];
  uStack_190 = 0;
  auVar11._8_8_ = dStack_200;
  auVar11._0_8_ = local_208;
  auVar12._8_8_ = adStack_1e0[0];
  auVar12._0_8_ = local_1e8;
  local_78 = vsubpd_avx(auVar11,auVar12);
  local_f8 = ZEXT1632(local_78);
  local_68 = local_198;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  dVar115 = local_1f8 - adStack_1e0[1];
  auVar52._8_8_ = dStack_200;
  auVar52._0_8_ = local_208;
  auVar13._8_8_ = adStack_1e0[0];
  auVar13._0_8_ = local_1e8;
  local_60 = vsubpd_avx(auVar52,auVar13);
  local_118 = ZEXT1632(local_60);
  local_50 = dVar115;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  uVar40 = (**(code **)(*(long *)&((((this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  auVar58 = vbroadcastsd_avx512vl(ZEXT816(0x3ff0000000000000));
  auVar107._8_8_ = local_198;
  auVar107._0_8_ = local_198;
  auVar107._16_8_ = local_198;
  auVar107._24_8_ = local_198;
  auVar128._8_8_ = dVar115;
  auVar128._0_8_ = dVar115;
  auVar128._16_8_ = dVar115;
  auVar128._24_8_ = dVar115;
  lVar41 = 1;
  uVar45 = 0xffffffff;
  adStack_1e0[3] = local_1f8 - adStack_1e0[1];
  auVar53._8_8_ = dStack_200;
  auVar53._0_8_ = local_208;
  uVar46 = CONCAT71((int7)((ulong)uVar40 >> 8),7) & 0xffffffff;
  lVar44 = 0x168;
  auVar51._8_8_ = adStack_1e0[0];
  auVar51._0_8_ = local_1e8;
  local_48 = vsubpd_avx(auVar53,auVar51);
  lVar42 = 0;
  auVar65 = vpermpd_avx2(local_f8,0x55);
  auVar95._0_8_ = local_f8._0_8_;
  auVar95._8_8_ = auVar95._0_8_;
  auVar95._16_8_ = auVar95._0_8_;
  auVar95._24_8_ = auVar95._0_8_;
  auVar10 = vpermpd_avx2(local_118,0x55);
  auVar120._0_8_ = local_118._0_8_;
  auVar120._8_8_ = auVar120._0_8_;
  auVar120._16_8_ = auVar120._0_8_;
  auVar120._24_8_ = auVar120._0_8_;
  adStack_1e0[4] = 0.0;
  local_38 = adStack_1e0[3];
  local_98 = ZEXT1632(local_48);
  auVar66 = vpermpd_avx2(local_98,0x55);
  auVar134._0_8_ = local_48._0_8_;
  auVar134._8_8_ = auVar134._0_8_;
  auVar134._16_8_ = auVar134._0_8_;
  auVar134._24_8_ = auVar134._0_8_;
  auVar136._8_8_ = adStack_1e0[3];
  auVar136._0_8_ = adStack_1e0[3];
  auVar136._16_8_ = adStack_1e0[3];
  auVar136._24_8_ = adStack_1e0[3];
  auVar59 = vgatherdpd_avx512vl(*(undefined4 *)(local_78 + in_R10));
  bVar8 = (byte)uVar46;
  auVar60._8_8_ = (ulong)((byte)(uVar46 >> 1) & 1) * auVar59._8_8_;
  auVar60._0_8_ = (ulong)(bVar8 & 1) * auVar59._0_8_;
  auVar60._16_8_ = (ulong)((byte)(uVar46 >> 2) & 1) * auVar59._16_8_;
  auVar60._24_8_ = 0;
  auVar59 = vgatherdpd_avx512vl(*(undefined4 *)((long)local_78 * 2));
  dVar129 = (double)((ulong)(bVar8 & 1) * auVar59._0_8_);
  dVar115 = (double)((ulong)((byte)(uVar46 >> 1) & 1) * auVar59._8_8_);
  auVar61._8_8_ = dVar115;
  auVar61._0_8_ = dVar129;
  dVar83 = (double)((ulong)((byte)(uVar46 >> 2) & 1) * auVar59._16_8_);
  auVar61._16_8_ = dVar83;
  auVar61._24_8_ = 0;
  auVar59 = vgatherdpd_avx512vl(in_stack_ffffff87);
  auVar62._8_8_ = (ulong)((byte)(uVar46 >> 1) & 1) * auVar59._8_8_;
  auVar62._0_8_ = (ulong)(bVar8 & 1) * auVar59._0_8_;
  auVar62._16_8_ = (ulong)((byte)(uVar46 >> 2) & 1) * auVar59._16_8_;
  auVar62._24_8_ = 0;
  auVar139._0_8_ = dVar129 * dVar129;
  auVar139._8_8_ = dVar115 * dVar115;
  auVar139._16_8_ = dVar83 * dVar83;
  auVar139._24_8_ = 0;
  auVar11 = vfmadd231pd_fma(auVar139,auVar60,auVar60);
  auVar11 = vfmadd231pd_fma(ZEXT1632(auVar11),auVar62,auVar62);
  auVar59 = vsqrtpd_avx(ZEXT1632(auVar11));
  auVar63._8_8_ = 0x10000000000000;
  auVar63._0_8_ = 0x10000000000000;
  auVar63._16_8_ = 0x10000000000000;
  auVar63._24_8_ = 0x10000000000000;
  uVar47 = vcmppd_avx512vl(auVar59,auVar63,5);
  uVar47 = uVar47 & 0xf;
  auVar59 = vdivpd_avx512vl(auVar58,auVar59);
  auVar63 = vmulpd_avx512vl(auVar61,auVar59);
  bVar8 = (byte)uVar47;
  dVar115 = (double)((ulong)(bVar8 & 1) * auVar63._0_8_);
  dVar83 = (double)((ulong)((byte)(uVar47 >> 1) & 1) * auVar63._8_8_);
  dVar129 = (double)((ulong)((byte)(uVar47 >> 2) & 1) * auVar63._16_8_);
  dVar67 = (double)((uVar47 >> 3) * auVar63._24_8_);
  auVar63 = vmulpd_avx512vl(auVar60,auVar59);
  auVar64._0_8_ = (ulong)(bVar8 & 1) * auVar63._0_8_ | (ulong)!(bool)(bVar8 & 1) * auVar58._0_8_;
  bVar9 = (bool)((byte)(uVar47 >> 1) & 1);
  auVar64._8_8_ = (ulong)bVar9 * auVar63._8_8_ | (ulong)!bVar9 * auVar58._8_8_;
  bVar9 = (bool)((byte)(uVar47 >> 2) & 1);
  auVar64._16_8_ = (ulong)bVar9 * auVar63._16_8_ | (ulong)!bVar9 * auVar58._16_8_;
  auVar64._24_8_ = (uVar47 >> 3) * auVar63._24_8_ | (ulong)!SUB81(uVar47 >> 3,0) * auVar58._24_8_;
  auVar63 = vmulpd_avx512vl(auVar62,auVar59);
  auVar59._8_8_ = (ulong)((byte)(uVar47 >> 1) & 1) * auVar63._8_8_;
  auVar59._0_8_ = (ulong)(bVar8 & 1) * auVar63._0_8_;
  auVar59._16_8_ = (ulong)((byte)(uVar47 >> 2) & 1) * auVar63._16_8_;
  auVar59._24_8_ = (uVar47 >> 3) * auVar63._24_8_;
  auVar58._0_8_ = dVar115 * auVar65._0_8_;
  auVar58._8_8_ = dVar83 * auVar65._8_8_;
  auVar58._16_8_ = dVar129 * auVar65._16_8_;
  auVar58._24_8_ = dVar67 * auVar65._24_8_;
  auVar65 = vfmadd231pd_avx512vl(auVar58,auVar64,auVar95);
  auVar96._0_8_ = dVar115 * auVar66._0_8_;
  auVar96._8_8_ = dVar83 * auVar66._8_8_;
  auVar96._16_8_ = dVar129 * auVar66._16_8_;
  auVar96._24_8_ = dVar67 * auVar66._24_8_;
  auVar66 = vfmadd231pd_avx512vl(auVar96,auVar134,auVar64);
  auVar11 = vfmadd231pd_fma(auVar65,auVar59,auVar107);
  auVar65._0_8_ = dVar115 * auVar10._0_8_;
  auVar65._8_8_ = dVar83 * auVar10._8_8_;
  auVar65._16_8_ = dVar129 * auVar10._16_8_;
  auVar65._24_8_ = dVar67 * auVar10._24_8_;
  auVar65 = vfmadd231pd_avx512vl(auVar65,auVar64,auVar120);
  auVar52 = vfmadd231pd_fma(auVar66,auVar59,auVar136);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x120) + ZEXT1632(_DAT_00969c20),uVar46,ZEXT1632(auVar11));
  auVar11 = vfmadd231pd_fma(auVar65,auVar59,auVar128);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x120) + ZEXT1632(_DAT_009b6ec0),uVar46,ZEXT1632(auVar11));
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x120) + ZEXT1632(_DAT_00969c30),uVar46,ZEXT1632(auVar52));
  do {
    psVar6 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&psVar6[3].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar42) == 0) {
      *(undefined8 *)((long)this->nodes_used_to_six + lVar44 + -0x4c) = 0;
      puVar1 = (undefined8 *)((long)this->nodes_used_to_six + lVar44 + -0x5c);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    else {
      lVar43 = lVar41;
      if (lVar42 == 0x20) {
        lVar43 = 0;
      }
      (**(code **)(*(long *)&(psVar6[lVar43].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
      uVar47 = uVar45 & 0xffffffff;
      if (lVar42 == 0) {
        uVar47 = 2;
      }
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
      local_158 = local_208 - local_1e8;
      local_168 = dStack_200 - adStack_1e0[0];
      local_1a8 = local_1f8 - adStack_1e0[1];
      (**(code **)(**(long **)((long)&(this->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar42) + 0x60))(&local_208);
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar43].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
      adStack_1e0[5] = local_208 - local_1e8;
      local_188 = dStack_200 - adStack_1e0[0];
      local_178 = local_1f8 - adStack_1e0[1];
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
      (**(code **)(**(long **)((long)&(this->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar42) + 0x60))(&local_1e8);
      dVar115 = *(double *)((long)adStack_1e0 + lVar44 + 8);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(double *)((long)adStack_1e0 + lVar44);
      dVar83 = *(double *)((long)adStack_1e0 + lVar44 + 0x10);
      auVar122._8_8_ = 0;
      auVar122._0_8_ = dVar83;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = dVar115 * dVar115;
      auVar11 = vfmadd231sd_fma(auVar131,auVar109,auVar109);
      auVar11 = vfmadd231sd_fma(auVar11,auVar122,auVar122);
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      bVar9 = 2.2250738585072014e-308 <= auVar11._0_8_;
      dVar129 = 1.0 / auVar11._0_8_;
      auVar48._0_8_ =
           (ulong)bVar9 * (long)(*(double *)((long)adStack_1e0 + lVar44) * dVar129) +
           (ulong)!bVar9 * 0x3ff0000000000000;
      auVar48._8_8_ = 0;
      dVar115 = (double)((ulong)bVar9 * (long)(dVar115 * dVar129));
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (ulong)bVar9 * (long)(dVar83 * dVar129);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_158;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = dVar115 * local_168;
      auVar11 = vfmadd231sd_fma(auVar123,auVar48,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = adStack_1e0[5];
      auVar135._8_8_ = 0;
      auVar135._0_8_ = dVar115 * local_188;
      auVar52 = vfmadd231sd_fma(auVar135,auVar48,auVar3);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_208 - local_1e8;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = (dStack_200 - adStack_1e0[0]) * dVar115;
      auVar53 = vfmadd231sd_fma(auVar86,auVar70,auVar48);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1a8;
      auVar11 = vfmadd231sd_fma(auVar11,auVar49,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_178;
      auVar52 = vfmadd231sd_fma(auVar52,auVar49,auVar5);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_1f8 - adStack_1e0[1];
      auVar53 = vfmadd231sd_fma(auVar53,auVar49,auVar99);
      auVar71._0_8_ = auVar53._0_8_ ^ 0x8000000000000000;
      auVar71._8_8_ = auVar53._8_8_ ^ 0x8000000000000000;
      auVar11 = vunpcklpd_avx(auVar11,auVar52);
      auVar124._0_8_ = auVar11._0_8_ ^ 0x8000000000000000;
      auVar124._8_8_ = auVar11._8_8_ ^ 0x8000000000000000;
      *(undefined1 (*) [16])((long)this->nodes_used_to_six + lVar44 + -0x5c) = auVar124;
      uVar40 = vmovlpd_avx(auVar71);
      *(undefined8 *)((long)this->nodes_used_to_six + lVar44 + -0x4c) = uVar40;
    }
    uVar45 = uVar45 + 1;
    lVar42 = lVar42 + 0x10;
    lVar41 = lVar41 + 1;
    lVar44 = lVar44 + 0x18;
  } while (lVar42 != 0x30);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_60._8_8_;
  auVar11 = vshufpd_avx(local_f8._0_16_,auVar72,1);
  auVar52 = vunpcklpd_avx(local_f8._0_16_,local_118._0_16_);
  auVar73._0_8_ = auVar11._0_8_ * auVar11._0_8_;
  auVar73._8_8_ = auVar11._8_8_ * auVar11._8_8_;
  auVar52 = vfmadd213pd_fma(auVar52,auVar52,auVar73);
  auVar30._8_8_ = uStack_190;
  auVar30._0_8_ = local_198;
  auVar11 = vmovhpd_avx(auVar30,local_50);
  auVar11 = vfmadd213pd_fma(auVar11,auVar11,auVar52);
  auVar11 = vsqrtpd_avx(auVar11);
  *(undefined1 (*) [16])(this->l0).m_data = auVar11;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = (double)local_48._8_8_ * (double)local_48._8_8_;
  auVar11 = vfmadd213sd_fma(local_98._0_16_,local_98._0_16_,auVar74);
  auVar23._8_8_ = adStack_1e0[4];
  auVar23._0_8_ = adStack_1e0[3];
  auVar11 = vfmadd213sd_fma(auVar23,auVar23,auVar11);
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  (this->l0).m_data[2] = auVar11._0_8_;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  adStack_1e0[5] = local_208 - local_1e8;
  uStack_1b0 = 0;
  local_178 = dStack_200 - adStack_1e0[0];
  uStack_170 = 0;
  local_188 = local_1f8 - adStack_1e0[1];
  uStack_180 = 0;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  auVar32._8_8_ = uStack_180;
  auVar32._0_8_ = local_188;
  auVar34._8_8_ = uStack_170;
  auVar34._0_8_ = local_178;
  auVar25._8_8_ = uStack_1b0;
  auVar25._0_8_ = adStack_1e0[5];
  auVar100._8_8_ = 0;
  auVar100._0_8_ = local_1f8 - adStack_1e0[1];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = (dStack_200 - adStack_1e0[0]) * local_188;
  auVar52 = vfmsub231sd_fma(auVar110,auVar34,auVar100);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_208 - local_1e8;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (local_1f8 - adStack_1e0[1]) * adStack_1e0[5];
  auVar11 = vfmsub231sd_fma(auVar101,auVar32,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = (local_208 - local_1e8) * local_178;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dStack_200 - adStack_1e0[0];
  auVar53 = vfmsub231sd_fma(auVar76,auVar25,auVar87);
  dVar129 = auVar11._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar129 * dVar129;
  auVar11 = vfmadd231sd_fma(auVar88,auVar52,auVar52);
  auVar11 = vfmadd231sd_fma(auVar11,auVar53,auVar53);
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  dVar83 = 1.0 / auVar11._0_8_;
  bVar9 = 2.2250738585072014e-308 <= auVar11._0_8_;
  auVar50._0_8_ =
       (double)((ulong)bVar9 * (long)(auVar52._0_8_ * dVar83) + (ulong)!bVar9 * 0x3ff0000000000000);
  auVar50._8_8_ = 0;
  dVar115 = (double)((ulong)bVar9 * (long)(auVar53._0_8_ * dVar83));
  local_b8._8_8_ = 0;
  local_b8._0_8_ = dVar115;
  dVar83 = (double)((ulong)bVar9 * (long)(dVar129 * dVar83));
  local_a8._8_8_ = 0;
  local_a8._0_8_ = dVar83;
  local_98._0_16_ = auVar50;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_188 * auVar50._0_8_;
  auVar53 = vfmsub231sd_fma(auVar89,local_b8,auVar25);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_178 * dVar115;
  auVar12 = vfmsub231sd_fma(auVar77,local_a8,auVar32);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = adStack_1e0[5] * dVar83;
  auVar13 = vfmsub231sd_fma(auVar102,auVar50,auVar34);
  auVar11 = vunpcklpd_avx(auVar34,auVar53);
  auVar52 = vunpcklpd_avx(auVar25,auVar12);
  auVar111._0_8_ = auVar11._0_8_ * auVar11._0_8_;
  auVar111._8_8_ = auVar11._8_8_ * auVar11._8_8_;
  auVar52 = vfmadd213pd_fma(auVar52,auVar52,auVar111);
  auVar11 = vunpcklpd_avx(auVar32,auVar13);
  auVar11 = vfmadd213pd_fma(auVar11,auVar11,auVar52);
  auVar52 = vsqrtpd_avx(auVar11);
  auVar14._8_8_ = 0x10000000000000;
  auVar14._0_8_ = 0x10000000000000;
  uVar47 = vcmppd_avx512vl(auVar52,auVar14,5);
  auVar11 = vshufpd_avx(auVar52,auVar52,1);
  dVar115 = 1.0 / auVar11._0_8_;
  uVar45 = (uVar47 & 3) >> 1;
  local_1a8 = (double)(uVar45 * (long)(auVar12._0_8_ * dVar115) +
                      (ulong)!SUB81(uVar45,0) * 0x3ff0000000000000);
  local_168 = (double)(uVar45 * (long)(auVar53._0_8_ * dVar115));
  uStack_160 = 0;
  local_158 = (double)(uVar45 * (long)(auVar13._0_8_ * dVar115));
  uStack_1a0 = 0;
  uStack_150 = 0;
  dVar129 = 1.0 / auVar52._0_8_;
  dVar115 = local_178 * dVar129;
  dVar83 = local_188 * dVar129;
  bVar8 = (byte)(uVar47 & 3);
  local_178 = (double)((ulong)(bVar8 & 1) * (long)(adStack_1e0[5] * dVar129) +
                      (ulong)!(bool)(bVar8 & 1) * 0x3ff0000000000000);
  local_188 = (double)((ulong)(bVar8 & 1) * (long)dVar115);
  adStack_1e0[5] = (double)((ulong)(bVar8 & 1) * (long)dVar83);
  uStack_170 = 0;
  uStack_180 = 0;
  uStack_1b0 = 0;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  local_118._0_8_ = local_208;
  local_f8._0_8_ = dStack_200;
  local_198 = local_1f8;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  local_118._0_8_ = local_1e8 * 0.0 + (double)local_118._0_8_;
  local_f8._0_8_ = adStack_1e0[0] * 0.0 + (double)local_f8._0_8_;
  adStack_1e0[3] = adStack_1e0[1] * 0.0 + local_198;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  local_198 = (double)local_118._0_8_ - local_140;
  local_118._0_8_ = (double)local_f8._0_8_ - local_138;
  local_f8._0_8_ = adStack_1e0[3] - local_130;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
  adStack_1e0[3] = local_208 * 0.0;
  local_128 = dStack_200 * 0.0;
  local_148 = local_1f8 * 0.0;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
  adStack_1e0[3] = adStack_1e0[3] + local_1e8;
  local_128 = local_128 + adStack_1e0[0];
  local_148 = local_148 + adStack_1e0[1];
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar35._8_8_ = uStack_170;
  auVar35._0_8_ = local_178;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_198;
  auVar26._8_8_ = uStack_1b0;
  auVar26._0_8_ = adStack_1e0[5];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_f8._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_188 * (double)local_118._0_8_;
  auVar11 = vfmadd231sd_fma(auVar78,auVar137,auVar35);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_188 * (local_128 - local_138);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = adStack_1e0[3] - local_140;
  auVar52 = vfmadd231sd_fma(auVar90,auVar117,auVar35);
  auVar11 = vfmadd231sd_fma(auVar11,auVar138,auVar26);
  auVar38._8_8_ = uStack_150;
  auVar38._0_8_ = local_158;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_148 - local_130;
  auVar52 = vfmadd231sd_fma(auVar52,auVar125,auVar26);
  auVar28._8_8_ = uStack_1a0;
  auVar28._0_8_ = local_1a8;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = local_168 * (double)local_118._0_8_;
  auVar53 = vfmadd231sd_fma(auVar112,auVar28,auVar137);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_168 * (local_128 - local_138);
  auVar12 = vfmadd231sd_fma(auVar103,auVar117,auVar28);
  auVar53 = vfmadd231sd_fma(auVar53,auVar38,auVar138);
  auVar12 = vfmadd231sd_fma(auVar12,auVar125,auVar38);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar52._0_8_ * auVar53._0_8_;
  auVar13 = vfmsub231sd_fma(auVar118,auVar11,auVar12);
  auVar15._8_8_ = 0x7fffffffffffffff;
  auVar15._0_8_ = 0x7fffffffffffffff;
  auVar51 = vandpd_avx512vl(auVar13,auVar15);
  if (auVar51._0_8_ <= 1e-10) {
    this_00 = GetLog();
    ChStreamOutAscii::operator<<
              (&this_00->super_ChStreamOutAscii,
               "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n");
  }
  else {
    auVar16._8_8_ = 0x8000000000000000;
    auVar16._0_8_ = 0x8000000000000000;
    auVar52 = vxorpd_avx512vl(auVar52,auVar16);
    auVar17._8_8_ = 0x8000000000000000;
    auVar17._0_8_ = 0x8000000000000000;
    auVar53 = vxorpd_avx512vl(auVar53,auVar17);
    dVar115 = 1.0 / auVar13._0_8_;
    auVar11 = vunpcklpd_avx(auVar53,auVar11);
    auVar52 = vunpcklpd_avx(auVar12,auVar52);
    (this->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array
    [0] = dVar115 * auVar52._0_8_;
    (this->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array
    [1] = dVar115 * auVar52._8_8_;
    (this->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array
    [2] = dVar115 * auVar11._0_8_;
    (this->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array
    [3] = dVar115 * auVar11._8_8_;
  }
  dVar115 = DAT_00b689a0;
  if (this != (ChElementShellBST *)&std::__ioinit) {
    (this->e0).m_data[0] = VNULL;
    (this->e0).m_data[1] = dVar115;
    (this->e0).m_data[2] = DAT_00b689a8;
  }
  dVar115 = DAT_00b689a0;
  if (this != (ChElementShellBST *)
              GetLog::static_cout_logger.super_ChLog.super_ChStreamOutAscii.number_format) {
    (this->k0).m_data[0] = VNULL;
    (this->k0).m_data[1] = dVar115;
    (this->k0).m_data[2] = DAT_00b689a8;
  }
  dVar115 = 0.0;
  local_128 = 2.2250738585072014e-308;
  uStack_120 = 0x10000000000000;
  do {
    peVar7 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)dVar115 + 3U].
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 == (element_type *)0x0) {
      (this->phi0).m_data[(long)dVar115] = 0.0;
      (this->rI).m_data[(long)dVar115] = 0.5;
      dVar115 = (double)((long)dVar115 + 1);
    }
    else {
      (**(code **)(*(long *)&peVar7->super_ChNodeFEAbase + 0x60))(&local_208);
      local_158 = (double)((long)dVar115 + 1);
      uVar47 = 0;
      if (dVar115 != 9.88131291682493e-324) {
        uVar47 = (ulong)local_158 & 0xffffffff;
      }
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
      uVar45 = (ulong)(SUB84(dVar115,0) - 1);
      if (dVar115 == 0.0) {
        uVar45 = 2;
      }
      adStack_1e0[5] = dStack_200;
      uStack_1b0 = 0;
      local_1a8 = local_1f8;
      uStack_1a0 = 0;
      local_188 = local_208;
      uStack_180 = 0;
      local_198 = local_1e8;
      uStack_190 = 0;
      local_178 = adStack_1e0[0];
      uStack_170 = 0;
      local_168 = adStack_1e0[1];
      uStack_160 = 0;
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar45].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d0);
      local_f8._8_8_ = 0;
      local_f8._0_8_ = local_140 - local_d0;
      local_118._8_8_ = 0;
      local_118._0_8_ = local_138 - local_c8;
      adStack_1e0[3] = local_130 - local_c0;
      adStack_1e0[4] = 0.0;
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar45].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
      auVar19._8_8_ = dStack_200;
      auVar19._0_8_ = local_208;
      auVar21._8_8_ = adStack_1e0[0];
      auVar21._0_8_ = local_1e8;
      auVar22._8_8_ = adStack_1e0[1];
      auVar22._0_8_ = adStack_1e0[0];
      auVar113._8_8_ = 0;
      auVar113._0_8_ = adStack_1e0[1];
      auVar33._8_8_ = uStack_180;
      auVar33._0_8_ = local_188;
      auVar11 = vunpcklpd_avx(auVar19,auVar33);
      auVar31._8_8_ = uStack_190;
      auVar31._0_8_ = local_198;
      auVar52 = vunpcklpd_avx(auVar21,auVar31);
      auVar36._8_8_ = uStack_170;
      auVar36._0_8_ = local_178;
      auVar53 = vunpcklpd_avx(auVar22,auVar36);
      auVar37._8_8_ = uStack_160;
      auVar37._0_8_ = local_168;
      auVar12 = vunpcklpd_avx(auVar113,auVar37);
      auVar24._8_8_ = adStack_1e0[4];
      auVar24._0_8_ = adStack_1e0[3];
      auVar13 = vunpcklpd_avx(local_b8,auVar24);
      auVar51 = vunpcklpd_avx(local_98._0_16_,local_f8._0_16_);
      auVar11 = vsubpd_avx(auVar11,auVar52);
      auVar20._8_8_ = local_1f8;
      auVar20._0_8_ = dStack_200;
      auVar27._8_8_ = uStack_1b0;
      auVar27._0_8_ = adStack_1e0[5];
      auVar52 = vunpcklpd_avx(auVar20,auVar27);
      auVar52 = vsubpd_avx(auVar52,auVar53);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_1f8;
      auVar29._8_8_ = uStack_1a0;
      auVar29._0_8_ = local_1a8;
      auVar53 = vunpcklpd_avx(auVar104,auVar29);
      auVar53 = vsubpd_avx(auVar53,auVar12);
      auVar12 = vunpcklpd_avx(local_a8,local_118._0_16_);
      auVar119._0_8_ = auVar12._0_8_ * auVar53._0_8_;
      auVar119._8_8_ = auVar12._8_8_ * auVar53._8_8_;
      auVar68 = vfmsub231pd_fma(auVar119,auVar52,auVar13);
      auVar126._0_8_ = auVar13._0_8_ * auVar11._0_8_;
      auVar126._8_8_ = auVar13._8_8_ * auVar11._8_8_;
      auVar91._0_8_ = auVar51._0_8_ * auVar52._0_8_;
      auVar91._8_8_ = auVar51._8_8_ * auVar52._8_8_;
      auVar52 = vfmsub231pd_fma(auVar126,auVar51,auVar53);
      auVar13 = vfmsub231pd_fma(auVar91,auVar11,auVar12);
      dVar83 = auVar52._0_8_;
      auVar79._0_8_ = dVar83 * dVar83;
      auVar79._8_8_ = auVar52._8_8_ * auVar52._8_8_;
      auVar11 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vshufpd_avx(auVar13,auVar13,1);
      auVar53 = vfmadd231pd_fma(auVar79,auVar68,auVar68);
      auVar53 = vfmadd231pd_fma(auVar53,auVar13,auVar13);
      auVar12 = vsqrtpd_avx(auVar53);
      auVar39._8_8_ = uStack_120;
      auVar39._0_8_ = local_128;
      uVar46 = vcmppd_avx512vl(auVar12,auVar39,5);
      auVar53 = vshufpd_avx(auVar12,auVar12,1);
      dVar129 = 1.0 / auVar53._0_8_;
      auVar53 = vshufpd_avx(auVar68,auVar68,1);
      uVar18 = (uVar46 & 3) >> 1;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar18 * (long)(auVar52._0_8_ * dVar129);
      auVar55._0_8_ =
           uVar18 * (long)(auVar53._0_8_ * dVar129) + (ulong)!SUB81(uVar18,0) * 0x3ff0000000000000;
      auVar55._8_8_ = 0;
      dVar129 = (double)(uVar18 * (long)(auVar11._0_8_ * dVar129));
      dVar67 = 1.0 / auVar12._0_8_;
      bVar8 = (byte)(uVar46 & 3);
      auVar56._0_8_ =
           (ulong)(bVar8 & 1) * (long)(auVar68._0_8_ * dVar67) +
           (ulong)!(bool)(bVar8 & 1) * 0x3ff0000000000000;
      auVar56._8_8_ = 0;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (ulong)(bVar8 & 1) * (long)(auVar13._0_8_ * dVar67);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_a8._0_8_ * dVar129;
      auVar11 = vfmadd231sd_fma(auVar92,local_98._0_16_,auVar55);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = dVar129 * (double)((ulong)(bVar8 & 1) * (long)(dVar83 * dVar67));
      auVar52 = vfmadd231sd_fma(auVar80,auVar55,auVar56);
      auVar11 = vfmadd231sd_fma(auVar11,local_b8,auVar54);
      auVar52 = vfmadd231sd_fma(auVar52,auVar54,auVar57);
      dVar83 = atan2(auVar52._0_8_,auVar11._0_8_);
      (this->phi0).m_data[(long)dVar115] = dVar83;
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)dVar115 + 3U].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_208);
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
      local_1a8 = local_208 - local_1e8;
      local_168 = dStack_200 - adStack_1e0[0];
      adStack_1e0[5] = local_1f8 - adStack_1e0[1];
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar45].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
      (**(code **)(*(long *)&((this->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar47].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d0);
      auVar133._8_8_ = 0;
      auVar133._0_8_ = adStack_1e0[5];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_168;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_1a8;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_130 - local_c0;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = (local_138 - local_c8) * adStack_1e0[5];
      auVar11 = vfmsub231sd_fma(auVar114,auVar132,auVar105);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_140 - local_d0;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (local_130 - local_c0) * local_1a8;
      auVar52 = vfmsub231sd_fma(auVar106,auVar81,auVar133);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = (local_140 - local_d0) * local_168;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_138 - local_c8;
      auVar53 = vfmsub231sd_fma(auVar82,auVar127,auVar93);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = auVar52._0_8_ * auVar52._0_8_;
      auVar11 = vfmadd231sd_fma(auVar94,auVar11,auVar11);
      auVar11 = vfmadd231sd_fma(auVar11,auVar53,auVar53);
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      dVar83 = (this->l0).m_data[(long)dVar115];
      dVar129 = 1.0 / (auVar11._0_8_ / dVar83);
      (this->rI).m_data[(long)dVar115] =
           dVar129 / (1.0 / ((this->area + this->area) / dVar83) + dVar129);
      dVar115 = local_158;
    }
  } while (dVar115 != 1.48219693752374e-323);
  dVar115 = this->area * 4.0;
  dVar83 = (this->k0).m_data[1];
  (this->k0).m_data[0] = dVar115 * (this->k0).m_data[0];
  (this->k0).m_data[1] = dVar115 * dVar83;
  (this->k0).m_data[2] = dVar115 * (this->k0).m_data[2];
  return;
}

Assistant:

void ChElementShellBST::SetupInitial(ChSystem* system) {

    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

	// Compute element area
	this->area = 0.5 * Vlength( Vcross(m_nodes[1]->GetX0() - m_nodes[0]->GetX0(), m_nodes[2]->GetX0() - m_nodes[0]->GetX0()) );
	
	// Compute cM and cI coefficients
	ChVector<> Li[3];
	Li[0] = m_nodes[2]->GetX0() - m_nodes[1]->GetX0();
	Li[1] = m_nodes[0]->GetX0() - m_nodes[2]->GetX0();
	Li[2] = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();

	for (int i = 0; i < 3; ++i) {
		this->cM[i][0] = Vdot(Li[0], Li[i].GetNormalized());
		this->cM[i][1] = Vdot(Li[1], Li[i].GetNormalized());
		this->cM[i][2] = Vdot(Li[2], Li[i].GetNormalized());
	}
	ChVector<> LIi[3];
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			LIi[0] = m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0();
			LIi[1] = m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0();
			LIi[2] = m_nodes[(i + 2) % 3]->GetX0() - m_nodes[i + 3]->GetX0();
			this->cI[i][0] = -Vdot(LIi[0], Li[i].GetNormalized());
			this->cI[i][1] = -Vdot(LIi[1], Li[i].GetNormalized());
			this->cI[i][2] = -Vdot(LIi[2], Li[i].GetNormalized());
		}
		else {
			cI[i][0] = cI[i][1] = cI[i][2] = 0;
		}
	}

	// Compute initial side lengths
	this->l0[0] = Li[0].Length();
	this->l0[1] = Li[1].Length();
	this->l0[2] = Li[2].Length();

	// Compute orthogonal system at triangle in carthesian basis
	ChVector<> t0_1 = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();
	ChVector<> t0_2 = m_nodes[2]->GetX0() - m_nodes[0]->GetX0();
	// Compute normal - and orthogonalize others
	ChVector<> t0_3 = Vcross(t0_1, t0_2).GetNormalized(); // The normal
	t0_2 = (Vcross(t0_3, t0_1)).GetNormalized();
	t0_1.Normalize();

	// Compute jacobian
	ShapeVector  N;
	this->ShapeFunctions(N, 1./3., 1./3.);
	ShapeVector  Nu;
	this->ShapeFunctionsDerivativeU(Nu, 1./3., 1./3.);
	ShapeVector  Nv;
	this->ShapeFunctionsDerivativeV(Nv, 1./3., 1./3.);

	//GetLog() << "Nu: " << Nu(0,0) << "  " << Nu(0,1) << "  " << Nu(0,2) << "\n" << "Nv: " << Nv(0,0) << "  " << Nv(0,1) << "  " << Nv(0,2) << "\n";

	ChVector<> P0_u = Nu(0,0) * m_nodes[0]->GetX0() + Nu(0,1) * m_nodes[1]->GetX0() + Nu(0,2) * m_nodes[2]->GetX0();
	ChVector<> P0_v = Nv(0,0) * m_nodes[0]->GetX0() + Nv(0,1) * m_nodes[1]->GetX0() + Nv(0,2) * m_nodes[2]->GetX0();
	//GetLog() << "t0_1= \n" << t0_1 <<  "\n";
	//GetLog() << "t0_2= \n" << t0_2 <<  "\n";
	//GetLog() << "P0_u= \n" << P0_u <<  "\n";
	//GetLog() << "P0_v= \n" << P0_v <<  "\n";

	ChMatrixNM<double, 2, 2> Jxu;
	Jxu(0, 0) = Vdot(P0_u, t0_1);
	Jxu(0, 1) = Vdot(P0_v, t0_1);
	Jxu(1, 0) = Vdot(P0_u, t0_2);
	Jxu(1, 1) = Vdot(P0_v, t0_2);
	//GetLog() << "Jxu= \n" << "  " << Jxu(0, 0) << "  " << Jxu(0, 1) << "\n" << "  " << Jxu(1, 0) << "  " << Jxu(1, 1) << "\n";

	bool invertible;
	Jxu.computeInverseWithCheck(this->Jux, invertible, 1e-10);
	if (!invertible)
		GetLog() << "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n";
	//GetLog() << "Jux= \n" << "  " << Jux(0, 0) << "  " << Jux(0, 1) << "\n" << "  " << Jux(1, 0) << "  " << Jux(1, 1) << "\n";

	ShapeVector  Nx;
	this->ShapeFunctionsDerivativeX(Nx, this->Jux, 1./3., 1./3.);
	ShapeVector  Ny;
	this->ShapeFunctionsDerivativeY(Ny, this->Jux, 1./3., 1./3.);

	//GetLog() << "Nx: " << Nx(0) << "  " << Nx(1) << "  " << Nx(2) << "\n" << "Ny: " << Ny(0) << "  " << Ny(1) << "  " << Ny(2) << "\n";
	

	// Compute initial strain e0
	this->e0 = VNULL;

	// Compute initial edge bendings phi[i]
	// Use the BST method in "kinked and branched shells"
	this->k0 = VNULL;
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			// normal of ith neighbouring triangle, opposed to ith triangle vertex:
			ChVector<> t0i_3 = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).GetNormalized();
			// boundary normal to shared edge:
			ChVector<> n_i = Vcross(m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0(), t0_3).GetNormalized();
			// edge angle
			double mcos_fi = Vdot(t0_3, t0i_3);
			double msin_fi = Vdot(n_i, t0i_3);
			this->phi0[i] = atan2(msin_fi, mcos_fi);
			// curvature
			// NOT NEEDED? k here as 'change' of curvature in bent meshes, only phi0 matters.
			//this->k0 += VNULL;
			// precompute rI coefficients = RIi/(RMi/RIi) = (1/hIi)/((1/hMi)(1/hIi)) assuming heights h remains not changed
			double hIi = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).Length() / this->l0[i];
			double hMi = 2.0 * this->area / this->l0[i];
			this->rI[i] = (1.0 / hIi) / ((1.0 / hMi) + (1.0 / hIi));
		}
		else {
			this->phi0[i] = 0;
			this->rI[i] = 0.5;
			//this->k0 += VNULL;
		}
	}
	this->k0 *= this->area * 4.0;

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

}